

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarView::wheelEvent(QCalendarView *this,QWheelEvent *event)

{
  int iVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  QCalendarModel *calendarModel;
  int numSteps;
  int numDegrees;
  QDate currentDate;
  QModelIndex index;
  QDate in_stack_ffffffffffffff68;
  QWheelEvent *in_stack_ffffffffffffff70;
  QCalendarModel *this_00;
  QAbstractItemView *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff8c;
  QCalendarModel *local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = QWheelEvent::angleDelta(in_stack_ffffffffffffff70);
  iVar1 = QPoint::y((QPoint *)0x51a68f);
  if (iVar1 < 0) {
    iVar1 = iVar1 + 7;
  }
  this_00 = (QCalendarModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex(in_stack_ffffffffffffff80);
  pQVar3 = QAbstractItemView::model(in_stack_ffffffffffffff80);
  local_30 = this_00;
  iVar2 = QModelIndex::row((QModelIndex *)&local_28);
  QModelIndex::column((QModelIndex *)&local_28);
  local_30 = (QCalendarModel *)
             QCalendarModel::dateForCell
                       ((QCalendarModel *)CONCAT44(in_stack_ffffffffffffff8c,iVar2),
                        (int)((ulong)pQVar3 >> 0x20),(int)pQVar3);
  iVar1 = -((iVar1 >> 3) / 0xf);
  uVar4 = QCalendarModel::calendar(this_00);
  local_30 = (QCalendarModel *)QDate::addMonths(&local_30,iVar1,uVar4);
  showDate((QCalendarView *)0x51a7a0,in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarView::wheelEvent(QWheelEvent *event)
{
    const int numDegrees = event->angleDelta().y() / 8;
    const int numSteps = numDegrees / 15;
    const QModelIndex index = currentIndex();
    QCalendarModel *calendarModel = static_cast<QCalendarModel*>(model());
    QDate currentDate = calendarModel->dateForCell(index.row(), index.column());
    currentDate = currentDate.addMonths(-numSteps, calendarModel->calendar());
    emit showDate(currentDate);
}